

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void geopolyCcwFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  undefined8 uVar1;
  bool bVar2;
  GeoPoly *p;
  long lVar3;
  long lVar4;
  double dVar5;
  
  p = geopolyFuncParam(context,*argv,(int *)0x0);
  if (p != (GeoPoly *)0x0) {
    dVar5 = geopolyArea(p);
    if ((dVar5 < 0.0) && (2 < (long)p->nVertex)) {
      lVar4 = 1;
      lVar3 = (long)p->nVertex + -2;
      do {
        uVar1 = *(undefined8 *)(p->a + lVar4 * 2);
        *(undefined8 *)(p->a + lVar4 * 2) = *(undefined8 *)(p->a + lVar3 * 2 + 2);
        *(undefined8 *)(p->a + lVar3 * 2 + 2) = uVar1;
        lVar4 = lVar4 + 1;
        bVar2 = lVar4 < lVar3;
        lVar3 = lVar3 + -1;
      } while (bVar2);
    }
    setResultStrOrError(context,(char *)p->hdr,p->nVertex * 8 + 4,'\0',
                        (_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3_free(p);
    return;
  }
  return;
}

Assistant:

static void geopolyCcwFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p = geopolyFuncParam(context, argv[0], 0);
  (void)argc;
  if( p ){
    if( geopolyArea(p)<0.0 ){
      int ii, jj;
      for(ii=1, jj=p->nVertex-1; ii<jj; ii++, jj--){
        GeoCoord t = GeoX(p,ii);
        GeoX(p,ii) = GeoX(p,jj);
        GeoX(p,jj) = t;
        t = GeoY(p,ii);
        GeoY(p,ii) = GeoY(p,jj);
        GeoY(p,jj) = t;
      }
    }
    sqlite3_result_blob(context, p->hdr,
       4+8*p->nVertex, SQLITE_TRANSIENT);
    sqlite3_free(p);
  }
}